

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.cpp
# Opt level: O0

MultiIndexSet *
TasGrid::MultiIndexManipulations::generateNonNestedPoints
          (MultiIndexSet *__return_storage_ptr__,MultiIndexSet *tensors,
          OneDimensionalWrapper *wrapper)

{
  int level;
  bool bVar1;
  int iVar2;
  size_t __n;
  size_type __n_00;
  int *__first;
  iterator __result;
  reference piVar3;
  reference piVar4;
  reference this;
  MultiIndexSet local_148;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_120;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_118;
  ulong local_110;
  size_t j;
  reverse_iterator l_1;
  int d;
  int i;
  reverse_iterator iter;
  Data2D<int> raw_points;
  int *l;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  int num_total;
  int *p;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> num_entries;
  int t;
  allocator<TasGrid::MultiIndexSet> local_49;
  undefined1 local_48 [8];
  vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> point_tensors;
  int num_tensors;
  size_t num_dimensions;
  OneDimensionalWrapper *wrapper_local;
  MultiIndexSet *tensors_local;
  
  __n = MultiIndexSet::getNumDimensions(tensors);
  point_tensors.super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(tensors);
  __n_00 = (size_type)
           point_tensors.
           super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<TasGrid::MultiIndexSet>::allocator(&local_49);
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::vector
            ((vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> *)local_48,
             __n_00,&local_49);
  std::allocator<TasGrid::MultiIndexSet>::~allocator(&local_49);
  for (num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage <
      point_tensors.
      super__Vector_base<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_;
      num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)num_entries.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    ::std::allocator<int>::allocator((allocator<int> *)((long)&p + 7));
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_78,__n,(allocator<int> *)((long)&p + 7));
    ::std::allocator<int>::~allocator((allocator<int> *)((long)&p + 7));
    __first = MultiIndexSet::getIndex
                        (tensors,(int)num_entries.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
    __result = ::std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_78);
    ::std::
    transform<int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::MultiIndexManipulations::generateNonNestedPoints(TasGrid::MultiIndexSet_const&,TasGrid::OneDimensionalWrapper_const&)::__0>
              (__first,__first + __n,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               __result._M_current,(anon_class_8_1_e273b773)wrapper);
    __range3._4_4_ = 1;
    __end3._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_78);
    l = (int *)::std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&l), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      __range3._4_4_ = *piVar3 * __range3._4_4_;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    Data2D<int>::Data2D<unsigned_long,int>((Data2D<int> *)&iter,__n,__range3._4_4_);
    Data2D<int>::rbegin((Data2D<int> *)&d);
    while (l_1.current._M_current._4_4_ = __range3._4_4_ + -1, -1 < l_1.current._M_current._4_4_) {
      l_1.current._M_current._0_4_ = l_1.current._M_current._4_4_;
      ::std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)&j);
      for (local_110 = 0; iVar2 = (int)l_1.current._M_current,
          __range3._4_4_ = l_1.current._M_current._4_4_, local_110 < __n; local_110 = local_110 + 1)
      {
        level = __first[~local_110 + __n];
        piVar4 = ::std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                              *)&j);
        iVar2 = OneDimensionalWrapper::getPointIndex(wrapper,level,iVar2 % *piVar4);
        ::std::
        reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
        ::operator++(&local_118,(int)&d);
        piVar4 = ::std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator*(&local_118);
        *piVar4 = iVar2;
        ::std::
        reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
        ::operator++(&local_120,(int)&j);
        piVar4 = ::std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 ::operator*(&local_120);
        l_1.current._M_current._0_4_ = (int)l_1.current._M_current / *piVar4;
      }
    }
    MultiIndexSet::MultiIndexSet(&local_148,(Data2D<int> *)&iter);
    this = std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::operator[]
                     ((vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> *)
                      local_48,(long)(int)num_entries.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    MultiIndexSet::operator=(this,&local_148);
    MultiIndexSet::~MultiIndexSet(&local_148);
    Data2D<int>::~Data2D((Data2D<int> *)&iter);
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78)
    ;
  }
  unionSets(__return_storage_ptr__,
            (vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> *)local_48);
  std::vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_>::~vector
            ((vector<TasGrid::MultiIndexSet,_std::allocator<TasGrid::MultiIndexSet>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet generateNonNestedPoints(const MultiIndexSet &tensors, const OneDimensionalWrapper &wrapper){
    size_t num_dimensions = tensors.getNumDimensions();
    int num_tensors = tensors.getNumIndexes();
    std::vector<MultiIndexSet> point_tensors((size_t) num_tensors);

    #pragma omp parallel for
    for(int t=0; t<num_tensors; t++){
        std::vector<int> num_entries(num_dimensions);
        const int *p = tensors.getIndex(t);
        std::transform(p, p + num_dimensions, num_entries.begin(), [&](int l)->int{ return wrapper.getNumPoints(l); });

        int num_total = 1;
        for(auto &l : num_entries) num_total *= l;

        Data2D<int> raw_points(num_dimensions, num_total);
        auto iter = raw_points.rbegin();
        for(int i=num_total-1; i>=0; i--){
            int d = i;
            auto l = num_entries.rbegin();
            // in order to generate indexes in the correct order, the for loop must go backwards
            for(size_t j = 0; j<num_dimensions; j++){
                *iter++ = wrapper.getPointIndex(p[num_dimensions - j - 1], (d % *l));
                d /= *l++;
            }
        }

        point_tensors[t] = MultiIndexSet(raw_points);
    }

    return unionSets(point_tensors);
}